

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

void __thiscall
vkt::sr::ShaderRenderCaseInstance::computeVertexReference
          (ShaderRenderCaseInstance *this,Surface *result,QuadGrid *quadGrid)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined8 *puVar4;
  int i_4;
  int i_1;
  int iVar5;
  undefined8 *puVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int x;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vec4 color;
  Vec4 c00;
  Vec4 c11;
  Vec4 c10;
  Vec4 c01;
  ShaderEvalContext evalCtx;
  RGBA local_39c;
  undefined1 local_398 [16];
  ulong local_380;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_378;
  ulong local_360;
  ulong local_358;
  ulong local_350;
  float local_348 [20];
  Vec4 local_2f8;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  ShaderEvalContext local_2a0;
  
  iVar1 = result->m_width;
  iVar2 = result->m_height;
  uVar3 = quadGrid->m_gridSize;
  uVar7 = uVar3 + 1;
  ShaderEvalContext::ShaderEvalContext(&local_2a0,quadGrid);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_378,(long)(int)(uVar7 * uVar7),(allocator_type *)&local_2e8);
  if ((ulong)uVar3 < 0x7fffffff) {
    lVar8 = 0;
    uVar11 = 0;
    do {
      local_398._0_4_ = (float)(int)uVar11 / (float)(int)uVar3;
      uVar10 = 0;
      do {
        ShaderEvalContext::reset
                  (&local_2a0,(float)(int)uVar10 / (float)(int)uVar3,(float)local_398._0_4_);
        (*this->m_evaluator->_vptr_ShaderEvaluator[2])(this->m_evaluator,&local_2a0);
        *(undefined8 *)
         local_378.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start[(int)lVar8 + (int)uVar10].m_data =
             local_2a0.color.m_data._0_8_;
        *(undefined8 *)
         (local_378.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start[(int)lVar8 + (int)uVar10].m_data + 2) =
             local_2a0.color.m_data._8_8_;
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
      lVar8 = lVar8 + (ulong)uVar7;
      bVar13 = uVar11 != uVar3;
      uVar11 = uVar11 + 1;
    } while (bVar13);
  }
  if (0 < (int)uVar3) {
    fVar14 = (float)(int)uVar3;
    uVar10 = 0;
    do {
      iVar12 = (int)uVar10;
      uVar11 = iVar12 + 1;
      fVar21 = ((float)iVar12 / fVar14) * (float)iVar2;
      fVar18 = ((float)(int)uVar11 / fVar14) * (float)iVar2;
      fVar15 = ceilf(fVar21 + -0.5);
      fVar16 = ceilf(fVar18 + -0.5);
      local_358 = (ulong)(iVar12 * uVar7);
      local_380 = (ulong)(uVar11 * uVar7);
      local_350 = 0;
      local_360 = (ulong)uVar11;
      do {
        iVar9 = (int)local_350;
        local_350 = local_350 + 1;
        fVar22 = ((float)iVar9 / fVar14) * (float)iVar1;
        fVar19 = ((float)(int)local_350 / fVar14) * (float)iVar1;
        local_398._0_4_ = fVar19;
        fVar19 = ceilf(fVar19 + -0.5);
        iVar12 = (int)local_358;
        iVar5 = (int)local_380;
        fVar17 = ceilf(fVar22 + -0.5);
        local_2e8 = *(undefined8 *)
                     local_378.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar9 + iVar12].m_data;
        uStack_2e0 = *(undefined8 *)
                      (local_378.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar9 + iVar12].m_data + 2);
        local_2b8 = *(undefined8 *)
                     local_378.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar9 + iVar12 + 1].m_data;
        uStack_2b0 = *(undefined8 *)
                      (local_378.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar9 + iVar12 + 1].m_data + 2);
        local_2c8 = *(undefined8 *)
                     local_378.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar5 + iVar9].m_data;
        uStack_2c0 = *(undefined8 *)
                      (local_378.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar5 + iVar9].m_data + 2);
        local_2d8 = *(undefined8 *)
                     local_378.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_380 + iVar9 + 1].m_data;
        uStack_2d0 = *(undefined8 *)
                      (local_378.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_380 + iVar9 + 1].m_data
                      + 2);
        if ((int)fVar15 < (int)fVar16) {
          fVar20 = (float)local_398._0_4_ - fVar22;
          iVar12 = (int)fVar15;
          do {
            if ((int)fVar17 < (int)fVar19) {
              fVar23 = (((float)iVar12 + 0.5) - fVar21) * (1.0 / (fVar18 - fVar21));
              fVar24 = 1.0;
              if (fVar23 <= 1.0) {
                fVar24 = fVar23;
              }
              fVar24 = (float)(-(uint)(0.0 < fVar23) & (uint)fVar24);
              local_398 = ZEXT416((uint)(1.0 - fVar24));
              iVar9 = (int)fVar17;
              do {
                fVar25 = (((float)iVar9 + 0.5) - fVar22) * (1.0 / fVar20);
                fVar23 = 1.0;
                if (fVar25 <= 1.0) {
                  fVar23 = fVar25;
                }
                fVar23 = (float)(-(uint)(0.0 < fVar25) & (uint)fVar23);
                fVar25 = fVar23 + fVar24;
                puVar6 = &local_2c8;
                puVar4 = &local_2d8;
                if (fVar25 <= 1.0) {
                  puVar6 = &local_2b8;
                  puVar4 = &local_2e8;
                }
                local_348[8] = 0.0;
                local_348[9] = 0.0;
                local_348[10] = 0.0;
                local_348[0xb] = 0.0;
                lVar8 = 0;
                do {
                  local_348[lVar8 + 8] =
                       *(float *)((long)puVar6 + lVar8 * 4) - *(float *)((long)puVar4 + lVar8 * 4);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                if (1.0 < fVar25) {
                  fVar23 = 1.0 - fVar23;
                }
                local_348[0xc] = 0.0;
                local_348[0xd] = 0.0;
                local_348[0xe] = 0.0;
                local_348[0xf] = 0.0;
                lVar8 = 0;
                do {
                  local_348[lVar8 + 0xc] = local_348[lVar8 + 8] * fVar23;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                local_348[0x10] = 0.0;
                local_348[0x11] = 0.0;
                local_348[0x12] = 0.0;
                local_348[0x13] = 0.0;
                lVar8 = 0;
                do {
                  local_348[lVar8 + 0x10] =
                       *(float *)((long)puVar4 + lVar8 * 4) + local_348[lVar8 + 0xc];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                puVar6 = &local_2b8;
                if (fVar25 <= 1.0) {
                  puVar6 = &local_2c8;
                }
                local_348[0] = 0.0;
                local_348[1] = 0.0;
                local_348[2] = 0.0;
                local_348[3] = 0.0;
                lVar8 = 0;
                do {
                  local_348[lVar8] =
                       *(float *)((long)puVar6 + lVar8 * 4) - *(float *)((long)puVar4 + lVar8 * 4);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                local_348[4] = 0.0;
                local_348[5] = 0.0;
                local_348[6] = 0.0;
                local_348[7] = 0.0;
                lVar8 = 0;
                do {
                  local_348[lVar8 + 4] =
                       local_348[lVar8] *
                       (float)(~-(uint)(fVar25 <= 1.0) & local_398._0_4_ |
                              -(uint)(fVar25 <= 1.0) & (uint)fVar24);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                local_2f8.m_data[0] = 0.0;
                local_2f8.m_data[1] = 0.0;
                local_2f8.m_data[2] = 0.0;
                local_2f8.m_data[3] = 0.0;
                lVar8 = 0;
                do {
                  local_2f8.m_data[lVar8] = local_348[lVar8 + 0x10] + local_348[lVar8 + 4];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                tcu::RGBA::RGBA(&local_39c,&local_2f8);
                *(deUint32 *)
                 ((long)(result->m_pixels).m_ptr + (long)(result->m_width * iVar12 + iVar9) * 4) =
                     local_39c.m_value;
                iVar9 = iVar9 + 1;
              } while (iVar9 != (int)fVar19);
            }
            iVar12 = iVar12 + 1;
          } while (iVar12 != (int)fVar16);
        }
      } while (local_350 != uVar3);
      uVar10 = local_360;
    } while ((uint)local_360 != uVar3);
  }
  if (local_378.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_378.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::computeVertexReference (tcu::Surface& result, const QuadGrid& quadGrid)
{
	DE_ASSERT(m_evaluator);

	// Buffer info.
	const int				width		= result.getWidth();
	const int				height		= result.getHeight();
	const int				gridSize	= quadGrid.getGridSize();
	const int				stride		= gridSize + 1;
	const bool				hasAlpha	= true; // \todo [2015-09-07 elecro] add correct alpha check
	ShaderEvalContext		evalCtx		(quadGrid);

	// Evaluate color for each vertex.
	std::vector<tcu::Vec4>	colors		((gridSize + 1) * (gridSize + 1));
	for (int y = 0; y < gridSize+1; y++)
	for (int x = 0; x < gridSize+1; x++)
	{
		const float	sx			= (float)x / (float)gridSize;
		const float	sy			= (float)y / (float)gridSize;
		const int	vtxNdx		= ((y * (gridSize+1)) + x);

		evalCtx.reset(sx, sy);
		m_evaluator->evaluate(evalCtx);
		DE_ASSERT(!evalCtx.isDiscarded); // Discard is not available in vertex shader.
		tcu::Vec4 color = evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		colors[vtxNdx] = color;
	}

	// Render quads.
	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
	{
		const float		x0		= (float)x       / (float)gridSize;
		const float		x1		= (float)(x + 1) / (float)gridSize;
		const float		y0		= (float)y       / (float)gridSize;
		const float		y1		= (float)(y + 1) / (float)gridSize;

		const float		sx0		= x0 * (float)width;
		const float		sx1		= x1 * (float)width;
		const float		sy0		= y0 * (float)height;
		const float		sy1		= y1 * (float)height;
		const float		oosx	= 1.0f / (sx1 - sx0);
		const float		oosy	= 1.0f / (sy1 - sy0);

		const int		ix0		= deCeilFloatToInt32(sx0 - 0.5f);
		const int		ix1		= deCeilFloatToInt32(sx1 - 0.5f);
		const int		iy0		= deCeilFloatToInt32(sy0 - 0.5f);
		const int		iy1		= deCeilFloatToInt32(sy1 - 0.5f);

		const int		v00		= (y * stride) + x;
		const int		v01		= (y * stride) + x + 1;
		const int		v10		= ((y + 1) * stride) + x;
		const int		v11		= ((y + 1) * stride) + x + 1;
		const tcu::Vec4	c00		= colors[v00];
		const tcu::Vec4	c01		= colors[v01];
		const tcu::Vec4	c10		= colors[v10];
		const tcu::Vec4	c11		= colors[v11];

		//printf("(%d,%d) -> (%f..%f, %f..%f) (%d..%d, %d..%d)\n", x, y, sx0, sx1, sy0, sy1, ix0, ix1, iy0, iy1);

		for (int iy = iy0; iy < iy1; iy++)
		for (int ix = ix0; ix < ix1; ix++)
		{
			DE_ASSERT(deInBounds32(ix, 0, width));
			DE_ASSERT(deInBounds32(iy, 0, height));

			const float			sfx		= (float)ix + 0.5f;
			const float			sfy		= (float)iy + 0.5f;
			const float			fx1		= deFloatClamp((sfx - sx0) * oosx, 0.0f, 1.0f);
			const float			fy1		= deFloatClamp((sfy - sy0) * oosy, 0.0f, 1.0f);

			// Triangle quad interpolation.
			const bool			tri		= fx1 + fy1 <= 1.0f;
			const float			tx		= tri ? fx1 : (1.0f-fx1);
			const float			ty		= tri ? fy1 : (1.0f-fy1);
			const tcu::Vec4&	t0		= tri ? c00 : c11;
			const tcu::Vec4&	t1		= tri ? c01 : c10;
			const tcu::Vec4&	t2		= tri ? c10 : c01;
			const tcu::Vec4		color	= t0 + (t1-t0)*tx + (t2-t0)*ty;

			result.setPixel(ix, iy, tcu::RGBA(color));
		}
	}
}